

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.h
# Opt level: O2

void fmt::v9::detail::
     convert_arg<signed_char,fmt::v9::basic_printf_context<fmt::v9::appender,char>,char>
               (basic_format_arg<fmt::v9::basic_printf_context<fmt::v9::appender,_char>_> *arg,
               char type)

{
  undefined1 value [16];
  undefined1 value_00 [16];
  undefined8 in_stack_ffffffffffffffe8;
  
  switch(arg->type_) {
  case int_type:
    arg_converter<signed_char,_fmt::v9::basic_printf_context<fmt::v9::appender,_char>_>::
    operator()<int,_0>((arg_converter<signed_char,_fmt::v9::basic_printf_context<fmt::v9::appender,_char>_>
                        *)&stack0xfffffffffffffff0,(arg->value_).field_0.int_value);
    break;
  case uint_type:
    arg_converter<signed_char,_fmt::v9::basic_printf_context<fmt::v9::appender,_char>_>::
    operator()<unsigned_int,_0>
              ((arg_converter<signed_char,_fmt::v9::basic_printf_context<fmt::v9::appender,_char>_>
                *)&stack0xfffffffffffffff0,(arg->value_).field_0.uint_value);
    break;
  case long_long_type:
    arg_converter<signed_char,_fmt::v9::basic_printf_context<fmt::v9::appender,_char>_>::
    operator()<long_long,_0>
              ((arg_converter<signed_char,_fmt::v9::basic_printf_context<fmt::v9::appender,_char>_>
                *)&stack0xfffffffffffffff0,(arg->value_).field_0.long_long_value);
    break;
  case ulong_long_type:
    arg_converter<signed_char,_fmt::v9::basic_printf_context<fmt::v9::appender,_char>_>::
    operator()<unsigned_long_long,_0>
              ((arg_converter<signed_char,_fmt::v9::basic_printf_context<fmt::v9::appender,_char>_>
                *)&stack0xfffffffffffffff0,(arg->value_).field_0.ulong_long_value);
    break;
  case int128_type:
    value._8_8_ = arg;
    value._0_8_ = in_stack_ffffffffffffffe8;
    arg_converter<signed_char,_fmt::v9::basic_printf_context<fmt::v9::appender,_char>_>::
    operator()<__int128,_0>
              ((arg_converter<signed_char,_fmt::v9::basic_printf_context<fmt::v9::appender,_char>_>
                *)&stack0xfffffffffffffff0,(__int128)value);
    break;
  case uint128_type:
    value_00._8_8_ = arg;
    value_00._0_8_ = in_stack_ffffffffffffffe8;
    arg_converter<signed_char,_fmt::v9::basic_printf_context<fmt::v9::appender,_char>_>::
    operator()<unsigned___int128,_0>
              ((arg_converter<signed_char,_fmt::v9::basic_printf_context<fmt::v9::appender,_char>_>
                *)&stack0xfffffffffffffff0,(unsigned___int128)value_00);
    break;
  case bool_type:
    arg_converter<signed_char,_fmt::v9::basic_printf_context<fmt::v9::appender,_char>_>::operator()
              ((arg_converter<signed_char,_fmt::v9::basic_printf_context<fmt::v9::appender,_char>_>
                *)&stack0xfffffffffffffff0,(arg->value_).field_0.bool_value);
    break;
  case char_type:
    arg_converter<signed_char,_fmt::v9::basic_printf_context<fmt::v9::appender,_char>_>::
    operator()<char,_0>((arg_converter<signed_char,_fmt::v9::basic_printf_context<fmt::v9::appender,_char>_>
                         *)&stack0xfffffffffffffff0,(arg->value_).field_0.char_value);
  }
  return;
}

Assistant:

void convert_arg(basic_format_arg<Context>& arg, Char type) {
  visit_format_arg(arg_converter<T, Context>(arg, type), arg);
}